

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlParseErr(xmlParserCtxtPtr ctxt,xmlParserErrors error,char *msg,xmlChar *str1,xmlChar *str2)

{
  xmlChar *str2_local;
  xmlChar *str1_local;
  char *msg_local;
  xmlParserErrors error_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->disableSAX == 0)) ||
     (ctxt->instate != XML_PARSER_EOF)) {
    if (ctxt != (xmlParserCtxtPtr)0x0) {
      ctxt->errNo = error;
    }
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctxt,
                    (void *)0x0,5,error,XML_ERR_ERROR,(char *)0x0,0,(char *)str1,(char *)str2,
                    (char *)0x0,0,0,msg,str1,str2);
    if (ctxt != (xmlParserCtxtPtr)0x0) {
      ctxt->wellFormed = 0;
    }
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
htmlParseErr(xmlParserCtxtPtr ctxt, xmlParserErrors error,
             const char *msg, const xmlChar *str1, const xmlChar *str2)
{
    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    if (ctxt != NULL)
	ctxt->errNo = error;
    __xmlRaiseError(NULL, NULL, NULL, ctxt, NULL, XML_FROM_HTML, error,
                    XML_ERR_ERROR, NULL, 0,
		    (const char *) str1, (const char *) str2,
		    NULL, 0, 0,
		    msg, str1, str2);
    if (ctxt != NULL)
	ctxt->wellFormed = 0;
}

/**
 * htmlParseErrInt:
 * @ctxt:  an HTML parser context
 * @error:  the error number
 * @msg:  the error message
 * @val:  integer info
 *
 * Handle a fatal parser error, i.e. violating Well-Formedness constraints
 */
static void LIBXML_ATTR_FORMAT(3,0)
htmlParseErrInt(xmlParserCtxtPtr ctxt, xmlParserErrors error,
             const char *msg, int val)
{
    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    if (ctxt != NULL)
	ctxt->errNo = error;
    __xmlRaiseError(NULL, NULL, NULL, ctxt, NULL, XML_FROM_HTML, error,
                    XML_ERR_ERROR, NULL, 0, NULL, NULL,
		    NULL, val, 0, msg, val);
    if (ctxt != NULL)
	ctxt->wellFormed = 0;
}